

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcheckmesh.cpp
# Opt level: O3

TPZCompElSide __thiscall TPZCheckMesh::FindElement(TPZCheckMesh *this,int connect)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  TPZCompEl **ppTVar4;
  TPZInterpolatedElement *this_00;
  TPZGeoEl *pTVar5;
  int64_t iVar6;
  TPZCompMesh *this_01;
  int iVar7;
  undefined8 in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  int side;
  undefined4 in_register_00000034;
  int connect_00;
  ulong nelem;
  TPZCompElSide TVar8;
  
  side = -1;
  uVar1 = (uint)*(undefined8 *)(*(long *)CONCAT44(in_register_00000034,connect) + 0x48);
  if ((int)uVar1 < 1) {
    this_01 = (TPZCompMesh *)0x0;
  }
  else {
    iVar7 = (int)in_RDX;
    nelem = 0;
    do {
      ppTVar4 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                          ((TPZChunkVector<TPZCompEl_*,_10> *)
                           (*(long *)CONCAT44(in_register_00000034,connect) + 0x40),nelem);
      this_01 = (TPZCompMesh *)*ppTVar4;
      in_RDX = extraout_RDX;
      if (this_01 != (TPZCompMesh *)0x0) {
        this_00 = (TPZInterpolatedElement *)
                  __dynamic_cast(this_01,&TPZCompEl::typeinfo,&TPZInterpolatedElement::typeinfo,0);
        pTVar5 = TPZCompEl::Reference((TPZCompEl *)this_01);
        iVar2 = (**(code **)(*(long *)pTVar5 + 0xf0))(pTVar5);
        in_RDX = extraout_RDX_00;
        if (0 < iVar2) {
          side = 0;
          do {
            iVar3 = (**(code **)(*(long *)&(this_00->super_TPZInterpolationSpace).super_TPZCompEl +
                                0x248))(this_00,side);
            in_RDX = extraout_RDX_01;
            if (0 < iVar3) {
              connect_00 = 0;
              do {
                iVar6 = TPZInterpolatedElement::SideConnectIndex(this_00,connect_00,side);
                in_RDX = extraout_RDX_02;
                if (iVar6 == iVar7) goto LAB_010cfe35;
                connect_00 = connect_00 + 1;
              } while (iVar3 != connect_00);
            }
            side = side + 1;
          } while (side != iVar2);
        }
      }
      nelem = nelem + 1;
    } while (nelem != (uVar1 & 0x7fffffff));
    this_01 = (TPZCompMesh *)0x0;
    side = -1;
  }
LAB_010cfe35:
  this->fMesh = this_01;
  *(int *)&this->fOut = side;
  TVar8._8_8_ = in_RDX;
  TVar8.fEl = (TPZCompEl *)this;
  return TVar8;
}

Assistant:

TPZCompElSide TPZCheckMesh::FindElement(int connect) {
	int nelem = fMesh->ElementVec().NElements();
	int el;
	for(el=0; el<nelem; el++) {
		TPZCompEl *cel = fMesh->ElementVec()[el];
		if(!cel) continue;
        TPZInterpolatedElement *intel = dynamic_cast<TPZInterpolatedElement *>(cel);
        TPZGeoEl *gel = cel->Reference();
        int ns = gel->NSides();
		
		for(int side=0; side<ns; side++) {
            int nsc = intel->NSideConnects(side);
            for (int ic=0; ic<nsc; ic++)
            {
                int64_t index = intel->SideConnectIndex(ic, side);
                if(index == connect) {
                    return TPZCompElSide(cel,side);
                }
			}
		}
	}
	TPZCompElSide nullside;
	return nullside;
}